

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall
pbrt::SingleLevelFlattener::traverse(SingleLevelFlattener *this,SP *object,affine3f *xfm)

{
  bool bVar1;
  SP *in_RDX;
  SingleLevelFlattener *in_RSI;
  shared_ptr<pbrt::Object> *in_RDI;
  shared_ptr<pbrt::Instance> inst_1;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *__range2;
  SP inst;
  SP emittedShape;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *in_stack_ffffffffffffff08;
  shared_ptr<pbrt::Instance> *in_stack_ffffffffffffff10;
  value_type *in_stack_ffffffffffffff18;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *this_00;
  affine3f *in_stack_ffffffffffffff78;
  element_type *in_stack_ffffffffffffff80;
  __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
  local_68;
  SP *in_stack_ffffffffffffffa0;
  SingleLevelFlattener *in_stack_ffffffffffffffa8;
  undefined1 local_38 [24];
  affine3f *in_stack_ffffffffffffffe0;
  SingleLevelFlattener *this_01;
  
  this_01 = in_RSI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RSI);
  if (bVar1) {
    this_00 = (vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
               *)local_38;
    std::shared_ptr<pbrt::Object>::shared_ptr
              ((shared_ptr<pbrt::Object> *)in_stack_ffffffffffffff10,
               (shared_ptr<pbrt::Object> *)in_stack_ffffffffffffff08);
    getOrCreateEmittedShapeFrom(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::shared_ptr<pbrt::Object>::~shared_ptr((shared_ptr<pbrt::Object> *)0x1b9009);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(local_38 + 0x10));
    if (bVar1) {
      std::make_shared<pbrt::Instance,std::shared_ptr<pbrt::Object>&,pbrt::math::affine3f_const&>
                (in_RDI,(affine3f *)in_RSI);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffa8);
      if (bVar1) {
        std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1b905e);
        std::
        vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>::
        push_back(this_00,in_stack_ffffffffffffff18);
      }
      std::shared_ptr<pbrt::Instance>::~shared_ptr((shared_ptr<pbrt::Instance> *)0x1b90e8);
    }
    std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b90f2);
    local_68._M_current =
         (shared_ptr<pbrt::Instance> *)
         std::
         vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
         ::begin(in_stack_ffffffffffffff08);
    std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
    ::end(in_stack_ffffffffffffff08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                               *)in_stack_ffffffffffffff10,
                              (__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                               *)in_stack_ffffffffffffff08), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
      ::operator*(&local_68);
      std::shared_ptr<pbrt::Instance>::shared_ptr
                (in_stack_ffffffffffffff10,(shared_ptr<pbrt::Instance> *)in_stack_ffffffffffffff08);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffff80);
      if (bVar1) {
        in_stack_ffffffffffffff10 = (shared_ptr<pbrt::Instance> *)&stack0xffffffffffffff80;
        std::__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1b9182);
        std::shared_ptr<pbrt::Object>::shared_ptr
                  ((shared_ptr<pbrt::Object> *)in_stack_ffffffffffffff10,
                   (shared_ptr<pbrt::Object> *)in_stack_ffffffffffffff08);
        std::__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1b91aa);
        math::operator*((affine3f *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        traverse(this_01,in_RDX,in_stack_ffffffffffffffe0);
        std::shared_ptr<pbrt::Object>::~shared_ptr((shared_ptr<pbrt::Object> *)0x1b91e2);
      }
      std::shared_ptr<pbrt::Instance>::~shared_ptr((shared_ptr<pbrt::Instance> *)0x1b9218);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
      ::operator++(&local_68);
    }
    std::shared_ptr<pbrt::Object>::~shared_ptr((shared_ptr<pbrt::Object> *)0x1b9237);
  }
  return;
}

Assistant:

void traverse(Object::SP object, const affine3f &xfm)
    {
      if (!object)
        return;
      
      Object::SP emittedShape = getOrCreateEmittedShapeFrom(object);
      if (emittedShape) {
        Instance::SP inst
          = std::make_shared<Instance>(emittedShape,xfm);
        if (inst)
          result->instances.push_back(inst);
      }
      
      for (auto inst : object->instances) {
        if (inst)
          traverse(inst->object,xfm * inst->xfm);
      }
    }